

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstr.cpp
# Opt level: O2

int lstrlenW(LPCWSTR lpString)

{
  long lVar1;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  lVar1 = 0;
  if (lpString != (LPCWSTR)0x0) {
    for (; lpString[lVar1] != L'\0'; lVar1 = lVar1 + 1) {
    }
  }
  return (int)lVar1;
}

Assistant:

int
PALAPI
lstrlenW(
	 IN LPCWSTR lpString)
{
    int nChar = 0;

    PERF_ENTRY(lstrlenW);
    ENTRY("lstrlenW (lpString=%p (%S))\n", lpString?lpString:W16_NULLSTRING, lpString?lpString:W16_NULLSTRING);
    if (lpString != NULL)
    {
        while (*lpString++)
        {
            nChar++;      
        }
    }
    LOGEXIT("lstrlenW returning int %d\n", nChar);
    PERF_EXIT(lstrlenW);
    return nChar;
}